

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O3

MPP_RET bits_model_param_init(RcModelV2Ctx *ctx)

{
  uint uVar1;
  RK_U32 size;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  uint size_00;
  
  uVar1 = (ctx->usr_cfg).igop;
  iVar2 = ((ctx->usr_cfg).stats_time * (ctx->usr_cfg).fps.fps_out_num) /
          (ctx->usr_cfg).fps.fps_out_denom;
  size_00 = iVar2 + (uint)(iVar2 == 0);
  bits_model_param_deinit(ctx);
  mpp_data_init_v2(&ctx->i_bit,2,0);
  if (ctx->i_bit == (MppDataV2 *)0x0) {
    pcVar3 = "i_bit init fail";
LAB_0023e61e:
    _mpp_log_l(2,"rc_model_v2",pcVar3,(char *)0x0);
    return MPP_ERR_MALLOC;
  }
  mpp_data_init_v2(&ctx->vi_bit,2,0);
  if (ctx->vi_bit == (MppDataV2 *)0x0) {
    pcVar3 = "vi_bit init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->p_bit,5,0);
  if (ctx->p_bit == (MppDataV2 *)0x0) {
    pcVar3 = "p_bit init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->pre_p_bit,8,0);
  if (ctx->pre_p_bit == (MppDataV2 *)0x0) {
    pcVar3 = "pre_p_bit init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->pre_i_bit,2,0);
  if (ctx->pre_i_bit == (MppDataV2 *)0x0) {
    pcVar3 = "pre_i_bit init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->pre_i_mean_qp,2,-1);
  if (ctx->pre_i_mean_qp == (MppDataV2 *)0x0) {
    pcVar3 = "pre_i_mean_qp init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->madi,8,0);
  if (ctx->madi == (MppDataV2 *)0x0) {
    pcVar3 = "madi init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->madp,8,0);
  if (ctx->madp == (MppDataV2 *)0x0) {
    pcVar3 = "madp init fail";
    goto LAB_0023e61e;
  }
  mpp_data_init_v2(&ctx->stat_rate,(ctx->usr_cfg).fps.fps_out_num,0);
  if (ctx->stat_rate == (MppDataV2 *)0x0) {
    uVar1 = (ctx->usr_cfg).fps.fps_out_num;
    pcVar3 = "stat_rate init fail fps_out_num %d";
  }
  else {
    mpp_data_init_v2(&ctx->stat_bits,size_00,ctx->bit_per_frame);
    if (ctx->stat_bits == (MppDataV2 *)0x0) {
      pcVar3 = "stat_bits init fail stat_len %d";
      uVar4 = (ulong)size_00;
      goto LAB_0023e6a2;
    }
    mpp_data_init_v2(&ctx->gop_bits,uVar1,0);
    if (ctx->gop_bits == (MppDataV2 *)0x0) {
      pcVar3 = "gop_bits init fail gop_len %d";
      uVar4 = (ulong)uVar1;
      goto LAB_0023e6a2;
    }
    size = (ctx->usr_cfg).refresh_len;
    if ((size == 0) ||
       (mpp_data_init_v2(&ctx->i_refresh_bit,size,0), ctx->i_refresh_bit != (MppDataV2 *)0x0)) {
      mpp_data_init_v2(&ctx->motion_level,10,0);
      if (ctx->motion_level == (MppDataV2 *)0x0) {
        pcVar3 = "motion_level init fail mad_len %d\n";
      }
      else {
        mpp_data_init_v2(&ctx->complex_level,10,0);
        if (ctx->complex_level != (MppDataV2 *)0x0) {
          return MPP_OK;
        }
        pcVar3 = "complex_level init fail mad_len %d\n";
      }
      uVar4 = 10;
      goto LAB_0023e6a2;
    }
    uVar1 = (ctx->usr_cfg).refresh_len;
    pcVar3 = "i_refresh_bit init fail refresh_len %d";
  }
  uVar4 = (ulong)uVar1;
LAB_0023e6a2:
  _mpp_log_l(2,"rc_model_v2",pcVar3,(char *)0x0,uVar4);
  return MPP_ERR_MALLOC;
}

Assistant:

MPP_RET bits_model_param_init(RcModelV2Ctx *ctx)
{
    RK_S32 gop_len = ctx->usr_cfg.igop;
    RcFpsCfg *fps = &ctx->usr_cfg.fps;
    RK_S32 mad_len = 10;
    RK_U32 stat_len = fps->fps_out_num * ctx->usr_cfg.stats_time / fps->fps_out_denom;
    stat_len = stat_len ? stat_len : 1;

    bits_model_param_deinit(ctx);
    mpp_data_init_v2(&ctx->i_bit, I_WINDOW_LEN, 0);
    if (ctx->i_bit == NULL) {
        mpp_err("i_bit init fail");
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->vi_bit, I_WINDOW_LEN, 0);
    if (ctx->vi_bit == NULL) {
        mpp_err("vi_bit init fail");
        return MPP_ERR_MALLOC;
    }
    mpp_data_init_v2(&ctx->p_bit, P_WINDOW1_LEN, 0);
    if (ctx->p_bit == NULL) {
        mpp_err("p_bit init fail");
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->pre_p_bit, P_WINDOW2_LEN, 0);
    if (ctx->pre_p_bit == NULL) {
        mpp_err("pre_p_bit init fail");
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->pre_i_bit, I_WINDOW_LEN, 0);
    if (ctx->pre_i_bit == NULL) {
        mpp_err("pre_i_bit init fail");
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->pre_i_mean_qp, I_WINDOW_LEN, -1);
    if (ctx->pre_i_mean_qp == NULL) {
        mpp_err("pre_i_mean_qp init fail");
        return MPP_ERR_MALLOC;
    }
    mpp_data_init_v2(&ctx->madi, P_WINDOW2_LEN, 0);
    if (ctx->madi == NULL) {
        mpp_err("madi init fail");
        return MPP_ERR_MALLOC;
    }
    mpp_data_init_v2(&ctx->madp, P_WINDOW2_LEN, 0);
    if (ctx->madp == NULL) {
        mpp_err("madp init fail");
        return MPP_ERR_MALLOC;
    }
    mpp_data_init_v2(&ctx->stat_rate, fps->fps_out_num, 0);
    if (ctx->stat_rate == NULL) {
        mpp_err("stat_rate init fail fps_out_num %d", fps->fps_out_num);
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->stat_bits, stat_len, ctx->bit_per_frame);
    if (ctx->stat_bits == NULL) {
        mpp_err("stat_bits init fail stat_len %d", stat_len);
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->gop_bits, gop_len, 0);
    if (ctx->gop_bits == NULL) {
        mpp_err("gop_bits init fail gop_len %d", gop_len);
        return MPP_ERR_MALLOC;
    }

    if (ctx->usr_cfg.refresh_len) {
        mpp_data_init_v2(&ctx->i_refresh_bit, ctx->usr_cfg.refresh_len, 0);
        if (ctx->i_refresh_bit == NULL) {
            mpp_err("i_refresh_bit init fail refresh_len %d", ctx->usr_cfg.refresh_len);
            return MPP_ERR_MALLOC;
        }
    }

    mpp_data_init_v2(&ctx->motion_level, mad_len, 0);
    if (ctx->motion_level == NULL) {
        mpp_err("motion_level init fail mad_len %d\n", mad_len);
        return MPP_ERR_MALLOC;
    }

    mpp_data_init_v2(&ctx->complex_level, mad_len, 0);
    if (ctx->complex_level == NULL) {
        mpp_err("complex_level init fail mad_len %d\n", mad_len);
        return MPP_ERR_MALLOC;
    }

    return MPP_OK;
}